

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O0

int ncnn::activate_op_inplace<ncnn::activate_op_stair<float>>(Mat *a,Option *opt)

{
  float *pfVar1;
  long in_RDI;
  float fVar2;
  int i;
  Mat cmat;
  int c;
  int size;
  int channels;
  activate_op_stair<float> op;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Mat local_60;
  int local_20;
  int local_1c;
  int local_18;
  
  local_18 = *(int *)(in_RDI + 0x34);
  local_1c = *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x30);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff94);
    for (in_stack_ffffffffffffff9c = 0; in_stack_ffffffffffffff9c < local_1c;
        in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
      Mat::operator[](&local_60,(long)in_stack_ffffffffffffff9c);
      fVar2 = activate_op_stair<float>::operator()
                        ((activate_op_stair<float> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (float *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      pfVar1 = Mat::operator[](&local_60,(long)in_stack_ffffffffffffff9c);
      *pfVar1 = fVar2;
    }
    Mat::~Mat((Mat *)0x1b4f76);
  }
  return 0;
}

Assistant:

static int activate_op_inplace(Mat &a, const Option &opt)
{
  Op op;
  int channels = a.c;
  int size = a.w * a.h;

  #pragma omp parallel for num_threads(opt.num_threads)
  for (int c = 0; c < channels; c++)
  {
    Mat cmat = a.channel(c);
    for (int i = 0; i < size; i++)
      cmat[i] = op(cmat[i]);
  }
  return 0;
}